

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O1

void qtree_bitins64(uchar *a,int nx,int ny,LONGLONG *b,int n,int bit)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uchar *puVar8;
  ulong uVar9;
  ulong *puVar10;
  ulong uVar11;
  ulong uVar12;
  byte *pbVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  
  uVar12 = 1L << ((byte)bit & 0x3f);
  iVar7 = 0;
  iVar1 = 0;
  if (1 < nx) {
    iVar5 = 0;
    iVar1 = 0;
    iVar7 = 0;
    do {
      if (ny < 2) {
        iVar16 = iVar1 * n;
        iVar6 = 0;
      }
      else {
        lVar3 = (long)iVar5;
        lVar2 = (long)n;
        puVar8 = a + iVar7;
        lVar15 = 0;
        lVar17 = 0;
        lVar4 = lVar3;
        do {
          switch(*puVar8) {
          case '\x01':
            puVar10 = (ulong *)((long)b + lVar15 + lVar3 * 8 + lVar2 * 8 + 8);
            break;
          case '\x02':
            puVar10 = (ulong *)(b + n + lVar4);
            break;
          case '\x03':
            puVar10 = (ulong *)(b + n + lVar4);
            b[lVar2 + lVar3 + lVar17 + 1] = b[lVar2 + lVar3 + lVar17 + 1] | uVar12;
            break;
          case '\x04':
            goto switchD_0017ac95_caseD_4;
          case '\x05':
            b[lVar2 + lVar3 + lVar17 + 1] = b[lVar2 + lVar3 + lVar17 + 1] | uVar12;
            goto switchD_0017ac95_caseD_4;
          case '\x06':
            goto switchD_0017ac95_caseD_6;
          case '\a':
            b[lVar2 + lVar3 + lVar17 + 1] = b[lVar2 + lVar3 + lVar17 + 1] | uVar12;
switchD_0017ac95_caseD_6:
            b[lVar2 + lVar3 + lVar17] = b[lVar2 + lVar3 + lVar17] | uVar12;
switchD_0017ac95_caseD_4:
            puVar10 = (ulong *)(b + lVar4 + 1);
            break;
          case '\b':
            goto switchD_0017ac95_caseD_8;
          case '\t':
            b[lVar2 + lVar3 + lVar17 + 1] = b[lVar2 + lVar3 + lVar17 + 1] | uVar12;
            goto switchD_0017ac95_caseD_8;
          case '\n':
            goto switchD_0017ac95_caseD_a;
          case '\v':
            b[lVar2 + lVar3 + lVar17 + 1] = b[lVar2 + lVar3 + lVar17 + 1] | uVar12;
switchD_0017ac95_caseD_a:
            b[lVar2 + lVar3 + lVar17] = b[lVar2 + lVar3 + lVar17] | uVar12;
            goto switchD_0017ac95_caseD_8;
          case '\f':
            goto switchD_0017ac95_caseD_c;
          case '\r':
            b[lVar2 + lVar3 + lVar17 + 1] = b[lVar2 + lVar3 + lVar17 + 1] | uVar12;
            goto switchD_0017ac95_caseD_c;
          case '\x0e':
            goto switchD_0017ac95_caseD_e;
          case '\x0f':
            b[lVar2 + lVar3 + lVar17 + 1] = b[lVar2 + lVar3 + lVar17 + 1] | uVar12;
switchD_0017ac95_caseD_e:
            b[lVar2 + lVar3 + lVar17] = b[lVar2 + lVar3 + lVar17] | uVar12;
switchD_0017ac95_caseD_c:
            b[lVar3 + lVar17 + 1] = b[lVar3 + lVar17 + 1] | uVar12;
switchD_0017ac95_caseD_8:
            puVar10 = (ulong *)(b + lVar4);
            break;
          default:
            goto switchD_0017ac95_default;
          }
          *puVar10 = *puVar10 | uVar12;
switchD_0017ac95_default:
          lVar4 = lVar4 + 2;
          puVar8 = puVar8 + 1;
          lVar17 = lVar17 + 2;
          lVar15 = lVar15 + 0x10;
        } while ((int)lVar17 < ny + -1);
        iVar7 = iVar7 + (ny - 2U >> 1) + 1;
        iVar16 = (int)lVar17 + iVar5;
        iVar6 = (ny - 2U & 0xfffffffe) + 2;
      }
      if (iVar6 < ny) {
        switch(a[iVar7]) {
        case '\x02':
        case '\x03':
        case '\x06':
        case '\a':
          iVar16 = iVar16 + n;
          break;
        default:
          goto switchD_0017ad5d_caseD_4;
        case '\b':
        case '\t':
        case '\f':
        case '\r':
          break;
        case '\n':
        case '\v':
        case '\x0e':
        case '\x0f':
          b[n + iVar16] = b[n + iVar16] | uVar12;
        }
        b[iVar16] = b[iVar16] | uVar12;
switchD_0017ad5d_caseD_4:
        iVar7 = iVar7 + 1;
      }
      iVar1 = iVar1 + 2;
      iVar5 = iVar5 + n * 2;
    } while (iVar1 < nx + -1);
  }
  if (iVar1 < nx) {
    iVar1 = iVar1 * n;
    iVar5 = 0;
    if (1 < ny) {
      uVar9 = (ulong)iVar1;
      pbVar13 = a + iVar7;
      lVar4 = 0;
      uVar14 = uVar9;
      do {
        if (*pbVar13 - 4 < 0xc) {
          uVar11 = uVar9 + lVar4;
          switch((uint)*pbVar13) {
          default:
            uVar11 = uVar14 | 1;
            break;
          case 8:
          case 9:
          case 10:
          case 0xb:
            break;
          case 0xc:
          case 0xd:
          case 0xe:
          case 0xf:
            b[uVar9 + lVar4 + 1] = b[uVar9 + lVar4 + 1] | uVar12;
          }
          b[uVar11] = b[uVar11] | uVar12;
        }
        uVar14 = uVar14 + 2;
        pbVar13 = pbVar13 + 1;
        lVar4 = lVar4 + 2;
      } while ((int)lVar4 < ny + -1);
      iVar7 = iVar7 + (ny - 2U >> 1) + 1;
      iVar5 = (ny - 2U & 0xfffffffe) + 2;
      iVar1 = iVar1 + (int)lVar4;
    }
    if ((iVar5 < ny) && ((a[iVar7] & 0xf8) == 8)) {
      b[iVar1] = b[iVar1] | uVar12;
    }
  }
  return;
}

Assistant:

static void
qtree_bitins64(unsigned char a[], int nx, int ny, LONGLONG b[], int n, int bit)
/*
   int n;		declared y dimension of b
*/
{
int i, j, k;
int s00;
LONGLONG plane_val;

	plane_val = ((LONGLONG) 1) << bit;

	/*
	 * expand each 2x2 block
	 */
	k = 0;							/* k   is index of a[i/2,j/2]	*/
	for (i = 0; i<nx-1; i += 2) {
		s00 = n*i;					/* s00 is index of b[i,j]		*/

  /* Note:
     this code appears to run very slightly faster on a 32-bit linux
     machine using s00+n rather than the s10 intermediate variable
  */
  /*		s10 = s00+n;	*/			/* s10 is index of b[i+1,j]	*/
		for (j = 0; j<ny-1; j += 2) {

		    switch (a[k]) {
		    case(0):
			break;
		    case(1):
			b[s00+n+1] |= plane_val;
			break;
		    case(2):
			b[s00+n  ] |= plane_val;
			break;
		    case(3):
			b[s00+n+1] |= plane_val;
			b[s00+n  ] |= plane_val;
			break;
		    case(4):
			b[s00+1] |= plane_val;
			break;
		    case(5):
			b[s00+n+1] |= plane_val;
			b[s00+1] |= plane_val;
			break;
		    case(6):
			b[s00+n  ] |= plane_val;
			b[s00+1] |= plane_val;
			break;
		    case(7):
			b[s00+n+1] |= plane_val;
			b[s00+n  ] |= plane_val;
			b[s00+1] |= plane_val;
			break;
		    case(8):
			b[s00  ] |= plane_val;
			break;
		    case(9):
			b[s00+n+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(10):
			b[s00+n  ] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(11):
			b[s00+n+1] |= plane_val;
			b[s00+n  ] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(12):
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(13):
			b[s00+n+1] |= plane_val;
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(14):
			b[s00+n  ] |= plane_val;
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(15):
			b[s00+n+1] |= plane_val;
			b[s00+n  ] |= plane_val;
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    }

/*
			b[s10+1] |= ((LONGLONG) ( a[k]     & 1)) << bit;
			b[s10  ] |= ((((LONGLONG)a[k])>>1) & 1) << bit;
			b[s00+1] |= ((((LONGLONG)a[k])>>2) & 1) << bit;
			b[s00  ] |= ((((LONGLONG)a[k])>>3) & 1) << bit;
*/
			s00 += 2;
/*			s10 += 2;  */
			k += 1;
		}
		if (j < ny) {
			/*
			 * row size is odd, do last element in row
			 * s00+1, s10+1 are off edge
			 */

		    switch (a[k]) {
		    case(0):
			break;
		    case(1):
			break;
		    case(2):
			b[s00+n  ] |= plane_val;
			break;
		    case(3):
			b[s00+n  ] |= plane_val;
			break;
		    case(4):
			break;
		    case(5):
			break;
		    case(6):
			b[s00+n  ] |= plane_val;
			break;
		    case(7):
			b[s00+n  ] |= plane_val;
			break;
		    case(8):
			b[s00  ] |= plane_val;
			break;
		    case(9):
			b[s00  ] |= plane_val;
			break;
		    case(10):
			b[s00+n  ] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(11):
			b[s00+n  ] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(12):
			b[s00  ] |= plane_val;
			break;
		    case(13):
			b[s00  ] |= plane_val;
			break;
		    case(14):
			b[s00+n  ] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(15):
			b[s00+n  ] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    }
/*
			b[s10  ] |= ((((LONGLONG)a[k])>>1) & 1) << bit;
			b[s00  ] |= ((((LONGLONG)a[k])>>3) & 1) << bit;
*/
			k += 1;
		}
	}
	if (i < nx) {
		/*
		 * column size is odd, do last row
		 * s10, s10+1 are off edge
		 */
		s00 = n*i;
		for (j = 0; j<ny-1; j += 2) {

		    switch (a[k]) {
		    case(0):
			break;
		    case(1):
			break;
		    case(2):
			break;
		    case(3):
			break;
		    case(4):
			b[s00+1] |= plane_val;
			break;
		    case(5):
			b[s00+1] |= plane_val;
			break;
		    case(6):
			b[s00+1] |= plane_val;
			break;
		    case(7):
			b[s00+1] |= plane_val;
			break;
		    case(8):
			b[s00  ] |= plane_val;
			break;
		    case(9):
			b[s00  ] |= plane_val;
			break;
		    case(10):
			b[s00  ] |= plane_val;
			break;
		    case(11):
			b[s00  ] |= plane_val;
			break;
		    case(12):
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(13):
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(14):
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(15):
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    }

/*
			b[s00+1] |= ((((LONGLONG)a[k])>>2) & 1) << bit;
			b[s00  ] |= ((((LONGLONG)a[k])>>3) & 1) << bit;
*/
			s00 += 2;
			k += 1;
		}
		if (j < ny) {
			/*
			 * both row and column size are odd, do corner element
			 * s00+1, s10, s10+1 are off edge
			 */

		    switch (a[k]) {
		    case(0):
			break;
		    case(1):
			break;
		    case(2):
			break;
		    case(3):
			break;
		    case(4):
			break;
		    case(5):
			break;
		    case(6):
			break;
		    case(7):
			break;
		    case(8):
			b[s00  ] |= plane_val;
			break;
		    case(9):
			b[s00  ] |= plane_val;
			break;
		    case(10):
			b[s00  ] |= plane_val;
			break;
		    case(11):
			b[s00  ] |= plane_val;
			break;
		    case(12):
			b[s00  ] |= plane_val;
			break;
		    case(13):
			b[s00  ] |= plane_val;
			break;
		    case(14):
			b[s00  ] |= plane_val;
			break;
		    case(15):
			b[s00  ] |= plane_val;
			break;
		    }
/*
			b[s00  ] |= ((((LONGLONG)a[k])>>3) & 1) << bit;
*/
			k += 1;
		}
	}
}